

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

win32 * __thiscall pstore::path::win32::base_name(win32 *this,string *path)

{
  size_type pos;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_58 [8];
  string p;
  string local_38 [8];
  string drive;
  string *path_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  split_drive(&local_98,path);
  std::tie<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&pos,&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_98);
  std::__cxx11::string::find_last_of((char *)local_58,0x1678ce);
  std::__cxx11::string::substr((ulong)this,(ulong)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string base_name (std::string const & path) {
                std::string drive;
                std::string p;
                std::tie (drive, p) = path::win32::split_drive (path);

                std::string::size_type const pos = p.find_last_of (R"(/\)");
                return p.substr ((pos == std::string::npos) ? 0 : pos + 1);
            }